

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * get_compTM(lua_State *L,Table *mt1,Table *mt2,TMS event)

{
  int iVar1;
  TValue *t1;
  TValue *t2;
  
  if ((mt1 == (Table *)0x0) || ((mt1->flags & 0x10) != 0)) {
    t1 = (TValue *)0x0;
  }
  else {
    t1 = luaT_gettm(mt1,TM_EQ,L->l_G->tmname[4]);
  }
  if (t1 != (TValue *)0x0) {
    if (mt1 == mt2) {
      return t1;
    }
    if ((mt2 == (Table *)0x0) || ((mt2->flags & 0x10) != 0)) {
      t2 = (TValue *)0x0;
    }
    else {
      t2 = luaT_gettm(mt2,TM_EQ,L->l_G->tmname[4]);
    }
    if (t2 != (TValue *)0x0) {
      iVar1 = luaO_rawequalObj(t1,t2);
      if (iVar1 != 0) {
        return t1;
      }
      return (TValue *)0x0;
    }
  }
  return (TValue *)0x0;
}

Assistant:

static const TValue*get_compTM(lua_State*L,Table*mt1,Table*mt2,
TMS event){
const TValue*tm1=fasttm(L,mt1,event);
const TValue*tm2;
if(tm1==NULL)return NULL;
if(mt1==mt2)return tm1;
tm2=fasttm(L,mt2,event);
if(tm2==NULL)return NULL;
if(luaO_rawequalObj(tm1,tm2))
return tm1;
return NULL;
}